

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::sse2::FlatLinearCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  Vector *pVVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  Scene *pSVar24;
  Geometry *pGVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  int iVar32;
  uint uVar33;
  RTCFilterFunctionN p_Var34;
  RTCRayN *pRVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  float fStack_210;
  float fStack_20c;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  float fStack_1d0;
  float fStack_1cc;
  Precalculations *local_1c0;
  RTCFilterFunctionNArguments local_1b8;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138 [4];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  float local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar24 = context->scene;
  local_1d8 = (ulong)line->sharedGeomID;
  uVar33 = (line->v0).field_0.i[0];
  pGVar25 = (pSVar24->geometries).items[local_1d8].ptr;
  fVar47 = pGVar25->fnumTimeSegments;
  fVar40 = (pGVar25->time_range).lower;
  local_1c0 = pre;
  fVar40 = floorf(((*(float *)(ray + k * 4 + 0x70) - fVar40) /
                  ((pGVar25->time_range).upper - fVar40)) * fVar47);
  fVar47 = fVar47 + -1.0;
  if (fVar47 <= fVar40) {
    fVar40 = fVar47;
  }
  fVar47 = 0.0;
  if (0.0 <= fVar40) {
    fVar47 = fVar40;
  }
  lVar26 = *(long *)&pGVar25[3].time_range.upper;
  lVar36 = (long)(int)fVar47 * 0x38;
  lVar37 = *(long *)(lVar26 + lVar36);
  lVar27 = *(long *)(lVar26 + 0x10 + lVar36);
  pfVar1 = (float *)(lVar37 + lVar27 * (ulong)uVar33);
  uVar21 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar37 + lVar27 * (ulong)uVar21);
  uVar22 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar37 + lVar27 * (ulong)uVar22);
  uVar23 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar37 + lVar27 * (ulong)uVar23);
  pfVar5 = (float *)(lVar37 + lVar27 * (ulong)(uVar33 + 1));
  pfVar6 = (float *)(lVar37 + lVar27 * (ulong)(uVar21 + 1));
  pfVar7 = (float *)(lVar37 + lVar27 * (ulong)(uVar22 + 1));
  fVar17 = *pfVar7;
  local_138[0] = pfVar7[2];
  lVar37 = lVar37 + lVar27 * (ulong)(uVar23 + 1);
  lVar27 = *(long *)(lVar26 + 0x38 + lVar36);
  lVar26 = *(long *)(lVar26 + 0x48 + lVar36);
  pfVar8 = (float *)(lVar27 + (ulong)uVar33 * lVar26);
  pfVar9 = (float *)(lVar27 + (ulong)uVar21 * lVar26);
  pfVar10 = (float *)(lVar27 + (ulong)uVar22 * lVar26);
  pfVar11 = (float *)(lVar27 + (ulong)uVar23 * lVar26);
  pfVar12 = (float *)(lVar27 + (ulong)(uVar33 + 1) * lVar26);
  pfVar13 = (float *)(lVar27 + (ulong)(uVar22 + 1) * lVar26);
  pfVar14 = (float *)(lVar27 + (ulong)(uVar21 + 1) * lVar26);
  pfVar15 = (float *)(lVar27 + lVar26 * (ulong)(uVar23 + 1));
  fVar63 = 1.0 - fVar17;
  local_188 = *pfVar1 * fVar63 + *pfVar8 * fVar17;
  fStack_184 = *pfVar2 * fVar63 + *pfVar9 * fVar17;
  fStack_180 = *pfVar3 * fVar63 + *pfVar10 * fVar17;
  fStack_17c = *pfVar4 * fVar63 + *pfVar11 * fVar17;
  local_168 = pfVar1[1] * fVar63 + pfVar8[1] * fVar17;
  fStack_164 = pfVar2[1] * fVar63 + pfVar9[1] * fVar17;
  fStack_160 = pfVar3[1] * fVar63 + pfVar10[1] * fVar17;
  fStack_15c = pfVar4[1] * fVar63 + pfVar11[1] * fVar17;
  local_178 = pfVar1[2] * fVar63 + pfVar8[2] * fVar17;
  fStack_174 = pfVar2[2] * fVar63 + pfVar9[2] * fVar17;
  fStack_170 = pfVar3[2] * fVar63 + pfVar10[2] * fVar17;
  fStack_16c = pfVar4[2] * fVar63 + pfVar11[2] * fVar17;
  local_148 = pfVar1[3] * fVar63 + pfVar8[3] * fVar17;
  fStack_144 = pfVar2[3] * fVar63 + pfVar9[3] * fVar17;
  fStack_140 = pfVar3[3] * fVar63 + pfVar10[3] * fVar17;
  fStack_13c = pfVar4[3] * fVar63 + pfVar11[3] * fVar17;
  local_f8[0] = *pfVar5 * fVar63 + *pfVar12 * fVar17;
  local_f8[1] = *pfVar6 * fVar63 + *pfVar14 * fVar17;
  local_f8[2] = fStack_210 * fVar63 + *pfVar13 * fVar17;
  local_f8[3] = fStack_20c * fVar63 + *pfVar15 * fVar17;
  local_e8[0] = pfVar5[1] * fVar63 + pfVar12[1] * fVar17;
  local_e8[1] = pfVar6[1] * fVar63 + pfVar14[1] * fVar17;
  local_e8[2] = pfVar7[1] * fVar63 + pfVar13[1] * fVar17;
  local_e8[3] = *(float *)(lVar37 + 4) * fVar63 + pfVar15[1] * fVar17;
  fVar41 = pfVar5[2] * fVar63 + pfVar12[2] * fVar17;
  fVar46 = pfVar6[2] * fVar63 + pfVar14[2] * fVar17;
  fStack_1e0 = fStack_1e0 * fVar63 + pfVar13[2] * fVar17;
  fStack_1dc = fStack_1dc * fVar63 + pfVar15[2] * fVar17;
  _local_1e8 = CONCAT44(fVar46,fVar41);
  local_138[1] = local_138[0];
  local_138[2] = local_138[0];
  local_138[3] = local_138[0];
  pVVar16 = &local_1c0->ray_space[k].vy;
  fVar64 = (pVVar16->field_0).m128[0];
  fVar65 = (pVVar16->field_0).m128[1];
  local_158 = (pVVar16->field_0).m128[2];
  pVVar16 = &local_1c0->ray_space[k].vz;
  fVar66 = (pVVar16->field_0).m128[0];
  fVar67 = (pVVar16->field_0).m128[1];
  fVar30 = (pVVar16->field_0).m128[2];
  fVar47 = *(float *)(ray + k * 4 + 0x10);
  fStack_1d0 = *(float *)(ray + k * 4 + 0x20);
  local_1d8 = CONCAT44(fStack_1d0,fStack_1d0);
  fVar72 = local_168 - fVar47;
  fVar73 = fStack_164 - fVar47;
  fVar74 = fStack_160 - fVar47;
  fVar75 = fStack_15c - fVar47;
  fVar68 = local_178 - fStack_1d0;
  fVar69 = fStack_174 - fStack_1d0;
  fVar70 = fStack_170 - fStack_1d0;
  fVar71 = fStack_16c - fStack_1d0;
  pVVar16 = &local_1c0->ray_space[k].vx;
  fVar77 = (pVVar16->field_0).m128[0];
  fVar81 = *(float *)((long)&pVVar16->field_0 + 4);
  fVar31 = *(float *)((long)&pVVar16->field_0 + 8);
  fVar40 = *(float *)(ray + k * 4);
  fVar84 = local_188 - fVar40;
  fVar85 = fStack_184 - fVar40;
  fVar86 = fStack_180 - fVar40;
  fVar87 = fStack_17c - fVar40;
  fVar55 = fVar77 * fVar84 + fVar64 * fVar72 + fVar66 * fVar68;
  fVar56 = fVar77 * fVar85 + fVar64 * fVar73 + fVar66 * fVar69;
  fVar57 = fVar77 * fVar86 + fVar64 * fVar74 + fVar66 * fVar70;
  fVar58 = fVar77 * fVar87 + fVar64 * fVar75 + fVar66 * fVar71;
  fVar59 = fVar81 * fVar84 + fVar65 * fVar72 + fVar67 * fVar68;
  fVar60 = fVar81 * fVar85 + fVar65 * fVar73 + fVar67 * fVar69;
  fVar61 = fVar81 * fVar86 + fVar65 * fVar74 + fVar67 * fVar70;
  fVar62 = fVar81 * fVar87 + fVar65 * fVar75 + fVar67 * fVar71;
  local_108[0] = fVar84 * fVar31 + fVar72 * local_158 + fVar68 * fVar30;
  local_108[1] = fVar85 * fVar31 + fVar73 * local_158 + fVar69 * fVar30;
  local_108[2] = fVar86 * fVar31 + fVar74 * local_158 + fVar70 * fVar30;
  local_108[3] = fVar87 * fVar31 + fVar75 * local_158 + fVar71 * fVar30;
  fVar75 = local_f8[0] - fVar40;
  fVar84 = local_f8[1] - fVar40;
  fVar85 = local_f8[2] - fVar40;
  fVar40 = local_f8[3] - fVar40;
  fVar68 = local_e8[0] - fVar47;
  fVar69 = local_e8[1] - fVar47;
  fVar70 = local_e8[2] - fVar47;
  fVar47 = local_e8[3] - fVar47;
  fVar71 = fVar41 - fStack_1d0;
  fVar72 = fVar46 - fStack_1d0;
  fVar73 = fStack_1e0 - fStack_1d0;
  fVar74 = fStack_1dc - fStack_1d0;
  fVar86 = (fVar77 * fVar75 + fVar64 * fVar68 + fVar66 * fVar71) - fVar55;
  fVar87 = (fVar77 * fVar84 + fVar64 * fVar69 + fVar66 * fVar72) - fVar56;
  fVar76 = (fVar77 * fVar85 + fVar64 * fVar70 + fVar66 * fVar73) - fVar57;
  fVar77 = (fVar77 * fVar40 + fVar64 * fVar47 + fVar66 * fVar74) - fVar58;
  fVar78 = (fVar81 * fVar75 + fVar65 * fVar68 + fVar67 * fVar71) - fVar59;
  fVar79 = (fVar81 * fVar84 + fVar65 * fVar69 + fVar67 * fVar72) - fVar60;
  fVar80 = (fVar81 * fVar85 + fVar65 * fVar70 + fVar67 * fVar73) - fVar61;
  fVar81 = (fVar81 * fVar40 + fVar65 * fVar47 + fVar67 * fVar74) - fVar62;
  auVar83._0_4_ = fVar78 * fVar78;
  auVar83._4_4_ = fVar79 * fVar79;
  auVar83._8_4_ = fVar80 * fVar80;
  auVar83._12_4_ = fVar81 * fVar81;
  auVar52._0_4_ = fVar86 * fVar86 + auVar83._0_4_;
  auVar52._4_4_ = fVar87 * fVar87 + auVar83._4_4_;
  auVar52._8_4_ = fVar76 * fVar76 + auVar83._8_4_;
  auVar52._12_4_ = fVar77 * fVar77 + auVar83._12_4_;
  auVar48 = rcpps(auVar83,auVar52);
  fVar64 = auVar48._0_4_;
  fVar65 = auVar48._4_4_;
  fVar66 = auVar48._8_4_;
  fVar67 = auVar48._12_4_;
  auVar82._0_4_ =
       (((float)DAT_01feca10 - auVar52._0_4_ * fVar64) * fVar64 + fVar64) *
       (-fVar59 * fVar78 - fVar55 * fVar86);
  auVar82._4_4_ =
       ((DAT_01feca10._4_4_ - auVar52._4_4_ * fVar65) * fVar65 + fVar65) *
       (-fVar60 * fVar79 - fVar56 * fVar87);
  auVar82._8_4_ =
       ((DAT_01feca10._8_4_ - auVar52._8_4_ * fVar66) * fVar66 + fVar66) *
       (-fVar61 * fVar80 - fVar57 * fVar76);
  auVar82._12_4_ =
       ((DAT_01feca10._12_4_ - auVar52._12_4_ * fVar67) * fVar67 + fVar67) *
       (-fVar62 * fVar81 - fVar58 * fVar77);
  auVar83 = minps(auVar82,_DAT_01feca10);
  auVar48._0_12_ = ZEXT812(0);
  auVar48._12_4_ = 0;
  local_128 = maxps(auVar83,auVar48);
  fVar64 = local_128._0_4_;
  fVar65 = local_128._4_4_;
  fVar66 = local_128._8_4_;
  fVar67 = local_128._12_4_;
  fVar55 = fVar86 * fVar64 + fVar55;
  fVar56 = fVar87 * fVar65 + fVar56;
  fVar57 = fVar76 * fVar66 + fVar57;
  fVar58 = fVar77 * fVar67 + fVar58;
  fVar59 = fVar78 * fVar64 + fVar59;
  fVar60 = fVar79 * fVar65 + fVar60;
  fVar61 = fVar80 * fVar66 + fVar61;
  fVar62 = fVar81 * fVar67 + fVar62;
  local_108[0] = ((fVar75 * fVar31 + fVar68 * local_158 + fVar71 * fVar30) - local_108[0]) * fVar64
                 + local_108[0];
  local_108[1] = ((fVar84 * fVar31 + fVar69 * local_158 + fVar72 * fVar30) - local_108[1]) * fVar65
                 + local_108[1];
  local_108[2] = ((fVar85 * fVar31 + fVar70 * local_158 + fVar73 * fVar30) - local_108[2]) * fVar66
                 + local_108[2];
  local_108[3] = ((fVar40 * fVar31 + fVar47 * local_158 + fVar74 * fVar30) - local_108[3]) * fVar67
                 + local_108[3];
  fVar64 = ((fVar63 * pfVar5[3] + fVar17 * pfVar12[3]) - local_148) * fVar64 + local_148;
  fVar65 = ((fVar63 * pfVar6[3] + fVar17 * pfVar14[3]) - fStack_144) * fVar65 + fStack_144;
  fVar66 = ((fVar63 * pfVar7[3] + fVar17 * pfVar13[3]) - fStack_140) * fVar66 + fStack_140;
  fVar67 = ((fVar63 * *(float *)(lVar37 + 0xc) + fVar17 * pfVar15[3]) - fStack_13c) * fVar67 +
           fStack_13c;
  fVar47 = *(float *)(ray + k * 4 + 0x80);
  fVar40 = *(float *)(ray + k * 4 + 0x30);
  fVar17 = *(float *)((long)local_1c0->ray_space + k * 4 + -0x10);
  auVar49._0_4_ =
       -(uint)((fVar64 + fVar64) * fVar17 < local_108[0]) &
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) &
       -(uint)(local_108[0] <= fVar47 && fVar40 <= local_108[0]) &
       -(uint)(fVar55 * fVar55 + fVar59 * fVar59 <= fVar64 * fVar64);
  auVar49._4_4_ =
       -(uint)((fVar65 + fVar65) * fVar17 < local_108[1]) &
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) &
       -(uint)(local_108[1] <= fVar47 && fVar40 <= local_108[1]) &
       -(uint)(fVar56 * fVar56 + fVar60 * fVar60 <= fVar65 * fVar65);
  auVar49._8_4_ =
       -(uint)((fVar66 + fVar66) * fVar17 < local_108[2]) &
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) &
       -(uint)(local_108[2] <= fVar47 && fVar40 <= local_108[2]) &
       -(uint)(fVar57 * fVar57 + fVar61 * fVar61 <= fVar66 * fVar66);
  auVar49._12_4_ =
       -(uint)((fVar67 + fVar67) * fVar17 < local_108[3]) &
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) &
       -(uint)(local_108[3] <= fVar47 && fVar40 <= local_108[3]) &
       -(uint)(fVar58 * fVar58 + fVar62 * fVar62 <= fVar67 * fVar67);
  iVar32 = movmskps((int)k * 0x30,auVar49);
  if (iVar32 != 0) {
    local_f8[0] = local_f8[0] - local_188;
    local_f8[1] = local_f8[1] - fStack_184;
    local_f8[2] = local_f8[2] - fStack_180;
    local_f8[3] = local_f8[3] - fStack_17c;
    local_e8[0] = local_e8[0] - local_168;
    local_e8[1] = local_e8[1] - fStack_164;
    local_e8[2] = local_e8[2] - fStack_160;
    local_e8[3] = local_e8[3] - fStack_15c;
    auVar53._4_4_ = -(uint)(local_f8[1] != 0.0);
    auVar53._0_4_ = -(uint)(local_f8[0] != 0.0);
    auVar53._8_4_ = -(uint)(local_f8[2] != 0.0);
    auVar53._12_4_ = -(uint)(local_f8[3] != 0.0);
    auVar54._4_4_ = -(uint)(local_e8[1] != 0.0);
    auVar54._0_4_ = -(uint)(local_e8[0] != 0.0);
    auVar54._8_4_ = -(uint)(local_e8[2] != 0.0);
    auVar54._12_4_ = -(uint)(local_e8[3] != 0.0);
    auVar42._4_4_ = -(uint)(fVar46 - fStack_174 != 0.0);
    auVar42._0_4_ = -(uint)(fVar41 - local_178 != 0.0);
    auVar42._8_4_ = -(uint)(fStack_1e0 - fStack_170 != 0.0);
    auVar42._12_4_ = -(uint)(fStack_1dc - fStack_16c != 0.0);
    auVar42 = auVar42 | auVar54 | auVar53;
    auVar50._0_4_ = auVar49._0_4_ & auVar42._0_4_;
    auVar50._4_4_ = auVar49._4_4_ & auVar42._4_4_;
    auVar50._8_4_ = auVar49._8_4_ & auVar42._8_4_;
    auVar50._12_4_ = auVar49._12_4_ & auVar42._12_4_;
    uVar33 = movmskps(iVar32,auVar50);
    if (uVar33 != 0) {
      local_118 = 0;
      uStack_110 = 0;
      local_d8[0] = fVar41 - local_178;
      local_d8[1] = fVar46 - fStack_174;
      local_d8[2] = fStack_1e0 - fStack_170;
      local_d8[3] = fStack_1dc - fStack_16c;
      uVar38 = (ulong)(uVar33 & 0xff);
      lVar37 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar48 = _DAT_01feba00;
      fStack_1cc = fStack_1d0;
      fStack_154 = local_158;
      fStack_150 = local_158;
      fStack_14c = local_158;
      do {
        local_1b8.hit = (RTCHitN *)&local_c8;
        local_1b8.valid = (int *)&local_1f8;
        uVar28 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        local_68 = local_138[uVar28];
        pGVar25 = (pSVar24->geometries).items[(uint)local_68].ptr;
        if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar38 = uVar38 ^ 1L << (uVar28 & 0x3f);
          bVar39 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar39 = false;
        }
        else {
          uVar18 = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar19 = *(undefined4 *)(local_128 + uVar28 * 4);
          uVar20 = *(undefined4 *)((long)&local_118 + uVar28 * 4);
          *(float *)(ray + k * 4 + 0x80) = local_108[uVar28];
          local_1b8.context = context->user;
          local_78 = (line->primIDs).field_0.i[uVar28];
          local_98._4_4_ = uVar19;
          local_98._0_4_ = uVar19;
          local_98._8_4_ = uVar19;
          local_98._12_4_ = uVar19;
          local_88._4_4_ = uVar20;
          local_88._0_4_ = uVar20;
          local_88._8_4_ = uVar20;
          local_88._12_4_ = uVar20;
          local_c8 = local_f8[uVar28];
          local_b8 = local_e8[uVar28];
          local_a8 = local_d8[uVar28];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          fStack_a4 = local_a8;
          fStack_a0 = local_a8;
          fStack_9c = local_a8;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          local_58 = (local_1b8.context)->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = (local_1b8.context)->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_1f8 = *(undefined8 *)(mm_lookupmask_ps + lVar37);
          uStack_1f0 = *(undefined8 *)(mm_lookupmask_ps + lVar37 + 8);
          local_1b8.geometryUserPtr = pGVar25->userPtr;
          local_1b8.N = 4;
          p_Var34 = pGVar25->occlusionFilterN;
          local_1b8.ray = (RTCRayN *)ray;
          if (p_Var34 != (RTCFilterFunctionN)0x0) {
            p_Var34 = (RTCFilterFunctionN)(*p_Var34)(&local_1b8);
            auVar48 = _DAT_01feba00;
          }
          auVar43._0_4_ = -(uint)((int)local_1f8 == 0);
          auVar43._4_4_ = -(uint)(local_1f8._4_4_ == 0);
          auVar43._8_4_ = -(uint)((int)uStack_1f0 == 0);
          auVar43._12_4_ = -(uint)(uStack_1f0._4_4_ == 0);
          uVar33 = movmskps((int)p_Var34,auVar43);
          pRVar35 = (RTCRayN *)(ulong)(uVar33 ^ 0xf);
          if ((uVar33 ^ 0xf) == 0) {
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar44 = auVar43 ^ auVar29;
          }
          else {
            p_Var34 = context->args->filter;
            if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var34)(&local_1b8);
              auVar48 = _DAT_01feba00;
            }
            auVar51._0_4_ = -(uint)((int)local_1f8 == 0);
            auVar51._4_4_ = -(uint)(local_1f8._4_4_ == 0);
            auVar51._8_4_ = -(uint)((int)uStack_1f0 == 0);
            auVar51._12_4_ = -(uint)(uStack_1f0._4_4_ == 0);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar44 = auVar51 ^ auVar44;
            *(undefined1 (*) [16])(local_1b8.ray + 0x80) =
                 ~auVar51 & auVar48 | *(undefined1 (*) [16])(local_1b8.ray + 0x80) & auVar51;
            pRVar35 = local_1b8.ray;
          }
          auVar45._0_4_ = auVar44._0_4_ << 0x1f;
          auVar45._4_4_ = auVar44._4_4_ << 0x1f;
          auVar45._8_4_ = auVar44._8_4_ << 0x1f;
          auVar45._12_4_ = auVar44._12_4_ << 0x1f;
          iVar32 = movmskps((int)pRVar35,auVar45);
          bVar39 = iVar32 == 0;
          if (bVar39) {
            *(undefined4 *)(ray + k * 4 + 0x80) = uVar18;
            uVar38 = uVar38 ^ 1L << (uVar28 & 0x3f);
          }
        }
      } while ((bVar39 != false) && (uVar38 != 0));
      return (bool)(bVar39 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }